

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
          *value)

{
  void *pvVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *pVVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Nullable<const_char_*> failure_msg;
  Rep *pRVar6;
  void **ppvVar7;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *value_local
  ;
  LogMessage local_28;
  
  local_28.errno_saver_.saved_errno_ = 0;
  local_28._4_4_ = 0;
  value_local = value;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestAllTypes*,decltype(nullptr)>
                          (&value_local,(void **)&local_28,"value != nullptr");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x1d0,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  bVar3 = SizeAtCapacity(this);
  if (bVar3) {
    InternalExtend(this,1);
  }
  else {
    bVar3 = AllocatedSizeAtCapacity(this);
    iVar5 = this->current_size_;
    if (bVar3) {
      ppvVar7 = element_at(this,iVar5);
      GenericTypeHandler<google::protobuf::MessageLite>::Delete((Type *)*ppvVar7,this->arena_);
      goto LAB_004335f7;
    }
    iVar4 = allocated_size(this);
    if (iVar5 < iVar4) {
      ppvVar7 = element_at(this,this->current_size_);
      pvVar1 = *ppvVar7;
      iVar5 = allocated_size(this);
      ppvVar7 = element_at(this,iVar5);
      *ppvVar7 = pvVar1;
    }
    else if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) goto LAB_004335f7;
  }
  pRVar6 = rep(this);
  pRVar6->allocated_size = pRVar6->allocated_size + 1;
LAB_004335f7:
  pVVar2 = value_local;
  iVar5 = this->current_size_;
  this->current_size_ = iVar5 + 1;
  ppvVar7 = element_at(this,iVar5);
  *ppvVar7 = pVVar2;
  return;
}

Assistant:

void UnsafeArenaAddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    // Make room for the new pointer.
    if (SizeAtCapacity()) {
      // The array is completely full with no cleared objects, so grow it.
      InternalExtend(1);
      ++rep()->allocated_size;
    } else if (AllocatedSizeAtCapacity()) {
      // There is no more space in the pointer array because it contains some
      // cleared objects awaiting reuse.  We don't want to grow the array in
      // this case because otherwise a loop calling AddAllocated() followed by
      // Clear() would leak memory.
      using H = CommonHandler<TypeHandler>;
      Delete<H>(element_at(current_size_), arena_);
    } else if (current_size_ < allocated_size()) {
      // We have some cleared objects.  We don't care about their order, so we
      // can just move the first one to the end to make space.
      element_at(allocated_size()) = element_at(current_size_);
      ++rep()->allocated_size;
    } else {
      // There are no cleared objects.
      if (!using_sso()) ++rep()->allocated_size;
    }

    element_at(ExchangeCurrentSize(current_size_ + 1)) = value;
  }